

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::addRenderTest
          (anon_unknown_0 *this,TestCaseGroup *group,string *namePrefix,string *descPrefix,
          int numIterations,ParamFlags flags,TestParams params)

{
  bool bVar1;
  SeparateShaderTest *this_00;
  Context *ctx;
  char *pcVar2;
  string local_370;
  string local_350;
  undefined4 local_330;
  ostringstream local_320 [8];
  ostringstream desc;
  ostringstream local_1a8 [8];
  ostringstream name;
  byte local_30;
  ParamFlags flags_local;
  int numIterations_local;
  string *descPrefix_local;
  string *namePrefix_local;
  TestCaseGroup *group_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__cxx11::ostringstream::ostringstream(local_320);
  std::operator<<((ostream *)local_1a8,(string *)group);
  std::operator<<((ostream *)local_320,(string *)namePrefix);
  params.initSingle = SUB41((numIterations & 4U) >> 2,0);
  params.switchVtx = SUB41((numIterations & 2U) >> 1,0);
  local_30 = (byte)numIterations;
  params.switchFrg = (bool)(local_30 & 1);
  pcVar2 = "separate_programs";
  if ((numIterations & 4U) != 0) {
    pcVar2 = "single_program";
  }
  std::operator<<((ostream *)local_1a8,pcVar2);
  pcVar2 = "Separate programs for each shader";
  if ((numIterations & 4U) != 0) {
    pcVar2 = "Single program with two shaders";
  }
  std::operator<<((ostream *)local_320,pcVar2);
  switch(numIterations & 3) {
  case 0:
    break;
  case 1:
    std::operator<<((ostream *)local_1a8,"_add_fragment");
    std::operator<<((ostream *)local_320,", then add a fragment program");
    break;
  case 2:
    std::operator<<((ostream *)local_1a8,"_add_vertex");
    std::operator<<((ostream *)local_320,", then add a vertex program");
    break;
  case 3:
    std::operator<<((ostream *)local_1a8,"_add_both");
    std::operator<<((ostream *)local_320,", then add both vertex and shader programs");
  }
  bVar1 = paramsValid(&params);
  if (bVar1) {
    this_00 = (SeparateShaderTest *)operator_new(0x180);
    ctx = TestCaseGroup::getContext((TestCaseGroup *)this);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::str();
    SeparateShaderTest::SeparateShaderTest
              (this_00,ctx,&local_350,&local_370,(int)descPrefix,&params,0x715d00);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_350);
  }
  local_330 = 1;
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return bVar1;
}

Assistant:

bool addRenderTest (TestCaseGroup& group, const string& namePrefix, const string& descPrefix,
					int numIterations, ParamFlags flags, TestParams params)
{
	ostringstream	name;
	ostringstream	desc;

	DE_ASSERT(areCaseParamFlagsValid(flags));

	name << namePrefix;
	desc << descPrefix;

	params.initSingle	= (flags & PARAMFLAGS_INIT_SINGLE) != 0;
	params.switchVtx	= (flags & PARAMFLAGS_SWITCH_VERTEX) != 0;
	params.switchFrg	= (flags & PARAMFLAGS_SWITCH_FRAGMENT) != 0;

	name << (flags & PARAMFLAGS_INIT_SINGLE ? "single_program" : "separate_programs");
	desc << (flags & PARAMFLAGS_INIT_SINGLE
			 ? "Single program with two shaders"
			 : "Separate programs for each shader");

	switch (flags & (PARAMFLAGS_SWITCH_FRAGMENT | PARAMFLAGS_SWITCH_VERTEX))
	{
		case 0:
			break;
		case PARAMFLAGS_SWITCH_FRAGMENT:
			name << "_add_fragment";
			desc << ", then add a fragment program";
			break;
		case PARAMFLAGS_SWITCH_VERTEX:
			name << "_add_vertex";
			desc << ", then add a vertex program";
			break;
		case PARAMFLAGS_SWITCH_FRAGMENT | PARAMFLAGS_SWITCH_VERTEX:
			name << "_add_both";
			desc << ", then add both vertex and shader programs";
			break;
	}

	if (!paramsValid(params))
		return false;

	group.addChild(new SeparateShaderTest(group.getContext(), name.str(), desc.str(),
										  numIterations, params,
										  &SeparateShaderTest::testPipelineRendering));

	return true;
}